

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherLinux.cpp
# Opt level: O1

void __thiscall FW::FileWatcherLinux::removeWatch(FileWatcherLinux *this,WatchID watchid)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  iterator __position;
  
  p_Var1 = &(this->mWatches)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < watchid]) {
    if (*(ulong *)(p_Var2 + 1) >= watchid) {
      p_Var4 = p_Var2;
    }
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (__position._M_node = p_Var4, watchid < *(ulong *)(p_Var4 + 1))) {
    __position._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    p_Var3 = __position._M_node[1]._M_parent;
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,FW::WatchStruct*>,std::_Select1st<std::pair<unsigned_long_const,FW::WatchStruct*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,FW::WatchStruct*>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,FW::WatchStruct*>,std::_Select1st<std::pair<unsigned_long_const,FW::WatchStruct*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,FW::WatchStruct*>>>
                        *)&this->mWatches,__position);
    inotify_rm_watch(this->mFD,(int)watchid);
    if (p_Var3 != (_Base_ptr)0x0) {
      p_Var3->_M_parent = (_Base_ptr)&PTR__Path_0011b8e8;
      if (p_Var3->_M_left != p_Var3 + 1) {
        operator_delete(p_Var3->_M_left,*(long *)(p_Var3 + 1) + 1);
      }
      operator_delete(p_Var3,0x38);
      return;
    }
  }
  return;
}

Assistant:

void FileWatcherLinux::removeWatch(WatchID watchid)
	{
		WatchMap::iterator iter = mWatches.find(watchid);

		if(iter == mWatches.end())
			return;

		WatchStruct* watch = iter->second;
		mWatches.erase(iter);
	
		inotify_rm_watch(mFD, watchid);
		
		delete watch;
		watch = 0;
	}